

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

MoveMapOwner __thiscall
gl4cts::BufferStorage::Buffer::MapRange
          (Buffer *this,GLintptr offset,GLsizeiptr length,GLenum access)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  MoveMapOwner MVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  Bind((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,this->m_target);
  pvVar2 = MapRange((Functions *)CONCAT44(extraout_var,iVar1),this->m_target,offset,length,access);
  MVar3.data = pvVar2;
  MVar3.buffer = this;
  return MVar3;
}

Assistant:

Buffer::MoveMapOwner Buffer::MapRange(glw::GLintptr offset, glw::GLsizeiptr length, glw::GLenum access)
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	Bind(gl, m_id, m_target);

	void* data = MapRange(gl, m_target, offset, length, access);

	MoveMapOwner map(this, data);

	return map;
}